

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

double * ON_BinarySearchDoubleArray(double key,double *base,size_t nel)

{
  ulong uVar1;
  double dVar2;
  
  if ((base != (double *)0x0 && nel != 0) && (dVar2 = key - *base, 0.0 <= dVar2)) {
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      return base;
    }
    dVar2 = key - base[nel - 1];
    if (dVar2 <= 0.0) {
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return base + (nel - 1);
      }
      do {
        uVar1 = nel >> 1;
        if (0.0 <= key - base[uVar1]) {
          if (key - base[uVar1] <= 0.0) {
            return base + uVar1;
          }
          base = base + uVar1 + 1;
          uVar1 = nel - (uVar1 + 1);
        }
        nel = uVar1;
      } while (uVar1 != 0);
    }
  }
  return (double *)0x0;
}

Assistant:

const double* ON_BinarySearchDoubleArray( double key, const double* base, size_t nel )
{
  if (nel > 0 && base )
  {
    size_t i;
    double d;

    // The end tests are not necessary, but they
    // seem to provide overall speed improvement
    // for the types of searches that call this
    // function.
    d = key-base[0];
    if ( d < 0.0 )
      return 0;
    if ( 0.0 == d )
      return base;

    d = key-base[nel-1];
    if ( d > 0.0 )
      return 0;
    if ( 0.0 == d )
      return (base + (nel-1));

    while ( nel > 0 )
    {
      i = nel/2;
      d = key - base[i];
      if ( d < 0.0 )
      {
        nel = i;
      }
      else if ( d > 0.0 )
      {
        i++;
        base += i;
        nel -= i;
      }
      else
      {
        return base+i;
      }
    }
  }
  return 0;
}